

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

bool slang::ast::Lookup::findTempVar
               (Scope *scope,TempVarSymbol *symbol,NameSyntax *syntax,LookupResult *result)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  NameComponents name;
  basic_string_view<char,_std::char_traits<char>_> __y;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  not_null<const_slang::ast::Scope_*> nVar1;
  bool bVar2;
  SyntaxKind SVar3;
  TempVarSymbol *nameParts_01;
  int colonParts;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  int local_204;
  Scope *local_200;
  underlying_type local_1f0;
  Symbol *pSStack_1e8;
  TempVarSymbol *local_1e0;
  RandomizeDetails *pRStack_1d8;
  AssertionInstanceDetails *local_1d0;
  underlying_type local_1c8;
  Symbol *pSStack_1c0;
  TempVarSymbol *local_1b8;
  RandomizeDetails *pRStack_1b0;
  AssertionInstanceDetails *local_1a8;
  ASTContext local_198;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> local_160 [3];
  
  local_204 = 0;
  local_160[0].data_ = (pointer)local_160[0].firstElement;
  local_160[0].len = 0;
  local_160[0].cap = 4;
  SVar3 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  nameParts_01 = symbol;
  if (SVar3 == ScopedName) {
    nameParts_01 = (TempVarSymbol *)local_160;
    syntax = anon_unknown_39::splitScopedName
                       ((ScopedNameSyntax *)syntax,
                        (SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *)
                        nameParts_01,&local_204);
    if (local_204 == 0) {
      SVar3 = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
      goto LAB_00219f80;
    }
  }
  else {
LAB_00219f80:
    if ((SVar3 - IdentifierName < 2) || (SVar3 == ClassName)) {
      anon_unknown_39::NameComponents::NameComponents((NameComponents *)&local_198,syntax);
      nVar1.ptr = local_198.scope.ptr;
      name.text._M_str._4_4_ = local_198._12_4_;
      name.text._M_str._0_4_ = local_198.lookupIndex;
      __y._M_str._0_4_ = local_198.lookupIndex;
      __y._M_len = (size_t)local_198.scope.ptr;
      __y._M_str._4_4_ = local_198._12_4_;
      local_1c8 = local_198.flags.m_bits;
      pSStack_1c0 = local_198.instanceOrProc;
      local_1b8 = local_198.firstTempVar;
      pRStack_1b0 = local_198.randomizeDetails;
      local_1a8 = local_198.assertionInstance;
      do {
        nameParts_01 = (TempVarSymbol *)
                       (symbol->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
        __x._M_len = (symbol->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_len;
        __x._M_str = (symbol->super_VariableSymbol).super_ValueSymbol.super_Symbol.name._M_str;
        bVar2 = std::operator==(__x,__y);
        if (bVar2) {
          result->found = (Symbol *)symbol;
          goto LAB_0021a013;
        }
        symbol = symbol->nextTemp;
      } while (symbol != (TempVarSymbol *)0x0);
      if (result->found != (Symbol *)0x0) {
LAB_0021a013:
        local_198.lookupIndex = 0xffffffff;
        local_198.assertionInstance = (AssertionInstanceDetails *)0x0;
        local_198.flags.m_bits = 0;
        local_198.instanceOrProc = (Symbol *)0x0;
        local_198.firstTempVar = (TempVarSymbol *)0x0;
        local_198.randomizeDetails = (RandomizeDetails *)0x0;
        nameParts_00._M_extent._M_extent_value = local_160[0].len;
        nameParts_00._M_ptr = local_160[0].data_;
        local_200 = nVar1.ptr;
        local_1f0 = local_1c8;
        pSStack_1e8 = pSStack_1c0;
        local_1e0 = local_1b8;
        pRStack_1d8 = pRStack_1b0;
        local_1d0 = local_1a8;
        name.text._M_len = (size_t)nVar1.ptr;
        name.range.startLoc = (SourceLocation)local_1c8;
        name.range.endLoc = (SourceLocation)pSStack_1c0;
        name.selectors._M_ptr = (pointer)local_1b8;
        name.selectors._M_extent._M_extent_value = (size_t)pRStack_1b0;
        name.paramAssignments = (ParameterValueAssignmentSyntax *)local_1a8;
        nameParts_01 = (TempVarSymbol *)local_160[0].len;
        local_198.scope.ptr = scope;
        bVar2 = anon_unknown_39::lookupDownward
                          (nameParts_00,name,&local_198,(bitmask<slang::ast::LookupFlags>)0x0,result
                          );
        goto LAB_0021a0a6;
      }
    }
  }
  bVar2 = false;
LAB_0021a0a6:
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::cleanup
            (local_160,(EVP_PKEY_CTX *)nameParts_01);
  return bVar2;
}

Assistant:

bool Lookup::findTempVar(const Scope& scope, const TempVarSymbol& symbol, const NameSyntax& syntax,
                         LookupResult& result) {
    int colonParts = 0;
    SmallVector<NamePlusLoc, 4> nameParts;
    const NameSyntax* first = &syntax;
    if (syntax.kind == SyntaxKind::ScopedName) {
        first = splitScopedName(syntax.as<ScopedNameSyntax>(), nameParts, colonParts);
        if (colonParts)
            return false;
    }

    NameComponents name;
    switch (first->kind) {
        case SyntaxKind::IdentifierName:
        case SyntaxKind::IdentifierSelectName:
        case SyntaxKind::ClassName:
            name = *first;
            break;
        default:
            return false;
    }

    const TempVarSymbol* curr = &symbol;
    do {
        if (curr->name == name.text) {
            result.found = curr;
            break;
        }
        curr = curr->nextTemp;
    } while (curr);

    if (!result.found)
        return false;

    ASTContext context(scope, LookupLocation::max);
    return lookupDownward(nameParts, name, context, LookupFlags::None, result);
}